

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall
vmtz_rule::set(vmtz_rule *this,os_tzrule_t *desc,char *abbr,int32_t gmtofs,int32_t save)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  caldate_t cd;
  caldate_t *in_stack_ffffffffffffffd0;
  undefined1 local_28;
  undefined2 local_24;
  
  *in_RDI = in_RDX;
  *(undefined4 *)(in_RDI + 1) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0xc) = in_R8D;
  *(int *)(in_RDI + 3) = in_RSI[5] * 1000;
  *(undefined1 *)((long)in_RDI + 0x15) = 0;
  if (*in_RSI == 0) {
    if (in_RSI[1] == 0) {
      if (in_RSI[2] != 0) {
        *(char *)(in_RDI + 2) = (char)in_RSI[2];
        *(char *)((long)in_RDI + 0x14) = (char)in_RSI[4];
        if (in_RSI[3] == 5) {
          *(undefined1 *)((long)in_RDI + 0x11) = 1;
        }
        else {
          *(undefined1 *)((long)in_RDI + 0x11) = 2;
          *(short *)((long)in_RDI + 0x12) = (char)((char)in_RSI[3] + -1) * 7 + 1;
        }
      }
    }
    else {
      *(undefined1 *)((long)in_RDI + 0x11) = 0;
      *(undefined1 *)(in_RDI + 2) = 1;
      *(short *)((long)in_RDI + 0x12) = (short)in_RSI[1];
    }
  }
  else {
    caldate_t::caldate_t((caldate_t *)&stack0xffffffffffffffd4,0x7db,1,*in_RSI);
    caldate_t::normalize_date(in_stack_ffffffffffffffd0);
    *(undefined1 *)((long)in_RDI + 0x11) = 0;
    *(undefined1 *)(in_RDI + 2) = local_28;
    *(undefined2 *)((long)in_RDI + 0x12) = local_24;
  }
  return;
}

Assistant:

void vmtz_rule::set(const os_tzrule_t *desc, const char *abbr,
                    int32_t gmtofs, int32_t save)
{
    /* set the basic description */
    this->fmt = abbr;
    this->gmtofs = gmtofs;
    this->save = save;

    /* the OS description always uses local wall clock time */
    this->at = desc->time * 1000;
    this->at_zone = 0;

    /* transcode the date to our format */
    if (desc->jday != 0)
    {
        /* 
         *   "Jn" = nth day of the year, NOT counting Feb 29.  Since the date
         *   mapping is the same for leap years and non-leap years, this is
         *   just an obtuse way of specifying a month and day.  So, figure
         *   the mm/dd date that the Jn date represents, and map it to our
         *   mode 0 (day <dd> of <month>).  We can figure the month/day by
         *   setting up a calendar with "January N" in any non-leap year -
         *   since it's a non-leap year, it won't have a Feb 29, so we'll get
         *   the right mapping for dates after J59.
         */
        caldate_t cd(2011, 1, desc->jday);
        cd.normalize_date();
        this->when = 0;
        this->mm = (char)cd.m;
        this->dd = (short)cd.d;
    }
    else if (desc->yday != 0)
    {
        /* 
         *   "n" = nth day of the year, counting Feb 29.  We can encode this
         *   as "January n", even if n > 31, since our calendar calculator
         *   handle overflows in the day of the month by carrying them into
         *   subsequent months. 
         */
        this->when = 0;
        this->mm = 1;
        this->dd = (short)desc->yday;
    }
    else if (desc->month != 0)
    {
        /* Month/week/day spec */
        this->mm = (char)desc->month;
        this->weekday = (char)desc->day;
        if (desc->week == 5)
        {
            /* week 5 means "last <weekday>", which is our mode 1 */
            this->when = 1;
        }
        else
        {
            /* 
             *   week 1-4 means "nth <weekday>"; we can encode this as mode
             *   2, "weekday>=n", where n is 1 for the first week, 8 for the
             *   second week, 15 for the third week, 22 for the fourth week
             */
            this->when = 2;
            this->dd = (char)(desc->week - 1)*7 + 1;
        }
    }
}